

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::cose::Sign1Message::SetExternalData
          (Error *__return_storage_ptr__,Sign1Message *this,ByteArray *aExternalData)

{
  char cVar1;
  byte *pbExternalData;
  byte *pbVar2;
  _Bool _Var3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pbExternalData =
       (aExternalData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pbVar2 = (aExternalData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pbExternalData == pbVar2) {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot set COSE SIGN1 message to empty external data";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x34;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar4 = "cannot set COSE SIGN1 message to empty external data";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar4,"");
          goto LAB_0016b8e2;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",&local_58);
    }
LAB_0016b8e2:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"cannot set COSE SIGN1 message to empty external data",
               (string_view)ZEXT816(0x34),args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  else {
    _Var3 = COSE_Sign0_SetExternal
                      (this->mSign,pbExternalData,(long)pbVar2 - (long)pbExternalData,
                       (cose_errback *)0x0);
    if (_Var3) {
      return __return_storage_ptr__;
    }
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "set COSE SIGN1 message external data failed";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2b;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar4 = "set COSE SIGN1 message external data failed";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar4 != "") {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar4,"");
          goto LAB_0016b92b;
        }
        cVar1 = *pcVar5;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar4,pcVar5);
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",&local_58);
    }
LAB_0016b92b:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"set COSE SIGN1 message external data failed",
               (string_view)ZEXT816(0x2b),args_00);
    local_80._0_4_ = kUnknown;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::SetExternalData(const ByteArray &aExternalData)
{
    Error error;

    VerifyOrExit(!aExternalData.empty(),
                 error = ERROR_INVALID_ARGS("cannot set COSE SIGN1 message to empty external data"));

    VerifyOrExit(COSE_Sign0_SetExternal(mSign, aExternalData.data(), aExternalData.size(), nullptr),
                 error = ERROR_UNKNOWN("set COSE SIGN1 message external data failed"));

exit:
    return error;
}